

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitDefaultArgs
          (ByteCodeGenerator *this,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  uint beginOffset;
  ParseNodePtr pnodeArg;
  anon_class_16_2_85211fcd local_48;
  FuncInfo *local_38;
  FuncInfo *funcInfo_local;
  
  local_48.funcInfo = &local_38;
  beginOffset = (this->m_writer).m_byteCodeData.currentOffset;
  local_48.this = this;
  local_38 = funcInfo;
  for (pnodeArg = pnodeFnc->pnodeParams; pnodeArg != (ParseNode *)0x0;
      pnodeArg = ParseNode::GetFormalNext(pnodeArg)) {
    EmitDefaultArgs::anon_class_16_2_85211fcd::operator()(&local_48,pnodeArg);
  }
  if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
    EmitDefaultArgs::anon_class_16_2_85211fcd::operator()(&local_48,pnodeFnc->pnodeRest);
  }
  if (beginOffset < (this->m_writer).m_byteCodeData.currentOffset) {
    PopulateFormalsScope(this,beginOffset,local_38,pnodeFnc);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitDefaultArgs(FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc)
{
    uint beginOffset = m_writer.GetCurrentOffset();

    MapFormals(pnodeFnc, [&](ParseNode *pnodeArg)
    {
        if (pnodeArg->nop == knopParamPattern)
        {
            this->StartStatement(pnodeArg);

            Assert(pnodeArg->AsParseNodeParamPattern()->location != Js::Constants::NoRegister);
            ParseNodePtr pnode1 = pnodeArg->AsParseNodeParamPattern()->pnode1;

            if (pnode1->IsPattern())
            {
                EmitAssignment(nullptr, pnode1, pnodeArg->AsParseNodeParamPattern()->location, this, funcInfo);
            }
            else
            {
                Assert(pnode1->nop == knopAsg);
                Assert(pnode1->AsParseNodeBin()->pnode1->IsPattern());
                EmitDestructuredValueOrInitializer(pnode1->AsParseNodeBin()->pnode1,
                    pnodeArg->AsParseNodeParamPattern()->location,
                    pnode1->AsParseNodeBin()->pnode2,
                    false /*isNonPatternAssignmentTarget*/,
                    this,
                    funcInfo);
            }
            this->EndStatement(pnodeArg);
            return;
        }
        else if (pnodeArg->IsVarLetOrConst())
        {
            Js::RegSlot location = pnodeArg->AsParseNodeVar()->sym->GetLocation();

            if (pnodeArg->AsParseNodeVar()->pnodeInit == nullptr)
            {
                // Since the formal hasn't been initialized in LdLetHeapArguments, we'll initialize it here.
                pnodeArg->AsParseNodeVar()->sym->SetNeedDeclaration(false);
                EmitPropStore(location, pnodeArg->AsParseNodeVar()->sym, pnodeArg->AsParseNodeVar()->pid, funcInfo, true);

                return;
            }

            // Load the default argument if we got undefined, skip RHS evaluation otherwise.
            Js::ByteCodeLabel noDefaultLabel = this->m_writer.DefineLabel();
            Js::ByteCodeLabel endLabel = this->m_writer.DefineLabel();
            this->StartStatement(pnodeArg);
            // Let us use strict not equal to differentiate between null and undefined
            m_writer.BrReg2(Js::OpCode::BrSrNeq_A, noDefaultLabel, location, funcInfo->undefinedConstantRegister);

            Emit(pnodeArg->AsParseNodeVar()->pnodeInit, this, funcInfo, false);
            pnodeArg->AsParseNodeVar()->sym->SetNeedDeclaration(false); // After emit to prevent foo(a = a)

            if (funcInfo->GetHasArguments() && pnodeArg->AsParseNodeVar()->sym->IsInSlot(this, funcInfo))
            {
                EmitPropStore(pnodeArg->AsParseNodeVar()->pnodeInit->location, pnodeArg->AsParseNodeVar()->sym, pnodeArg->AsParseNodeVar()->pid, funcInfo, true);

                m_writer.Br(endLabel);
            }
            else
            {
                EmitAssignment(nullptr, pnodeArg, pnodeArg->AsParseNodeVar()->pnodeInit->location, this, funcInfo);
            }

            funcInfo->ReleaseLoc(pnodeArg->AsParseNodeVar()->pnodeInit);

            m_writer.MarkLabel(noDefaultLabel);

            if (funcInfo->GetHasArguments() && pnodeArg->AsParseNodeVar()->sym->IsInSlot(this, funcInfo))
            {
                EmitPropStore(location, pnodeArg->AsParseNodeVar()->sym, pnodeArg->AsParseNodeVar()->pid, funcInfo, true);

                m_writer.MarkLabel(endLabel);
            }

            this->EndStatement(pnodeArg);
        }
    });

    if (m_writer.GetCurrentOffset() > beginOffset)
    {
        PopulateFormalsScope(beginOffset, funcInfo, pnodeFnc);
    }
}